

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::CreateInvalidTypeTest::iterate(CreateInvalidTypeTest *this)

{
  deBool dVar1;
  EGLSyncKHR pvVar2;
  MessageBuilder *pMVar3;
  TestError *this_00;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_4c8;
  MessageBuilder local_4b8;
  MessageBuilder local_338;
  int local_1b8 [2];
  EGLint error;
  MessageBuilder local_1a8;
  TestLog *local_28;
  TestLog *log;
  Library *egl;
  CreateInvalidTypeTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_28 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar2 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)(log,(this->super_SyncTest).m_eglDisplay,0x3038,0);
  (this->super_SyncTest).m_sync = pvVar2;
  tcu::TestLog::operator<<(&local_1a8,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,&(this->super_SyncTest).m_sync);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&(this->super_SyncTest).m_eglDisplay);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [18])", EGL_NONE, NULL)");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  local_1b8[0] = (*(code *)log->m_log[6].lock)();
  tcu::TestLog::operator<<(&local_338,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_338,local_1b8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [17])" = eglGetError()");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  if (local_1b8[0] == 0x3004) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || ((this->super_SyncTest).m_sync != (EGLSyncKHR)0x0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"m_sync == EGL_NO_SYNC_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x175);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_4b8,local_28,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_4b8,(char (*) [19])"Unexpected error \'");
    EVar4 = eglu::getErrorStr(local_1b8[0]);
    local_4c8.m_getName = EVar4.m_getName;
    local_4c8.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_4c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [29])"\' expected EGL_BAD_ATTRIBUTE");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, EGL_NONE, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", EGL_NONE, NULL)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_ATTRIBUTE)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_ATTRIBUTE" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(m_sync == EGL_NO_SYNC_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}